

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::select_multiple::element::element(element *this,string *val,string *msg,bool sel)

{
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  basic_message<char> *in_RDI;
  
  in_RDI->n_ = in_RDI->n_ & 0xfffffffeU | (uint)(in_CL & 1);
  *(byte *)&in_RDI->n_ = (byte)in_RDI->n_ & 0xfd;
  in_RDI->n_ = (in_RDI->n_ & 0xfffffffbU) + (uint)(in_CL & 1) * 4;
  std::__cxx11::string::string((string *)&in_RDI->c_id_,in_RSI);
  std::__cxx11::string::string((string *)&(in_RDI->id_)._M_string_length,in_RDX);
  booster::locale::basic_message<char>::basic_message(in_RDI);
  return;
}

Assistant:

select_multiple::element::element(std::string const &val,std::string const &msg,bool sel) :
	selected(sel),
	need_translation(0),
	original_select(sel),
	id(val),
	str_option(msg)
{
}